

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffinit(fitsfile **fptr,char *name,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  int *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int create_disk_file;
  int handle;
  char compspec [80];
  char tmplfile [1025];
  char outfile [1025];
  char urltype [20];
  char *url;
  int clobber;
  int slen;
  int driver;
  int ii;
  int local_8d4;
  uint uVar5;
  int in_stack_fffffffffffff734;
  char in_stack_fffffffffffff738;
  undefined7 in_stack_fffffffffffff739;
  int *in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  char *in_stack_fffffffffffff750;
  fitsfile *in_stack_fffffffffffff758;
  char *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  int *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff780;
  char in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff789;
  int *in_stack_fffffffffffff798;
  char *in_stack_fffffffffffff7a0;
  fitsfile *in_stack_fffffffffffff7a8;
  char local_468 [1040];
  char local_58 [32];
  char *local_38;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  char *local_18;
  long *local_10;
  int local_4;
  
  local_30 = 0;
  *in_RDI = 0;
  if (*in_RDX < 1) {
    iVar2 = *in_RDX;
    if (iVar2 == -0x6a) {
      *in_RDX = 0;
    }
    uVar5 = (uint)(iVar2 == -0x6a);
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (need_to_initialize != 0) {
      iVar2 = fits_init_cfitsio();
      *local_20 = iVar2;
    }
    if (*local_20 < 1) {
      for (local_38 = local_18; *local_38 == ' '; local_38 = local_38 + 1) {
      }
      if (*local_38 == '\0') {
        ffpmsg((char *)0x11d646);
        *local_20 = 0x69;
        local_4 = 0x69;
      }
      else {
        if (uVar5 == 0) {
          cVar1 = *local_38;
          if (cVar1 == '!') {
            local_38 = local_38 + 1;
          }
          local_30 = (uint)(cVar1 == '!');
          ffourl(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                 (char *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                 (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                 in_stack_fffffffffffff740);
          if (0 < *local_20) {
            ffpmsg((char *)0x11d766);
            ffpmsg((char *)0x11d773);
            return *local_20;
          }
        }
        else {
          sVar3 = strlen(local_38);
          if (0x400 < sVar3) {
            ffpmsg((char *)0x11d68c);
            *local_20 = 0x69;
            return 0x69;
          }
          strcpy(local_468,local_38);
          strcpy(local_58,"file://");
          in_stack_fffffffffffff788 = '\0';
          in_stack_fffffffffffff738 = '\0';
        }
        iVar2 = urltype2driver((char *)CONCAT71(in_stack_fffffffffffff739,in_stack_fffffffffffff738)
                               ,(int *)CONCAT44(in_stack_fffffffffffff734,uVar5));
        *local_20 = iVar2;
        if (*local_20 == 0) {
          if ((local_30 != 0) && (driverTable[local_28].remove != (_func_int_char_ptr *)0x0)) {
            (*driverTable[local_28].remove)(local_468);
          }
          if (driverTable[local_28].create == (_func_int_char_ptr_int_ptr *)0x0) {
            ffpmsg((char *)0x11d8dd);
            ffpmsg((char *)0x11d8ea);
            *local_20 = 0x69;
            local_4 = 0x69;
          }
          else {
            iVar2 = (*driverTable[local_28].create)(local_468,(int *)&stack0xfffffffffffff734);
            *local_20 = iVar2;
            if (*local_20 == 0) {
              pvVar4 = calloc(1,0x10);
              *local_10 = (long)pvVar4;
              if (*local_10 == 0) {
                (*driverTable[local_28].close)(in_stack_fffffffffffff734);
                ffpmsg((char *)0x11d962);
                ffpmsg((char *)0x11d96f);
                *local_20 = 0x71;
                local_4 = 0x71;
              }
              else {
                pvVar4 = calloc(1,0x7e8);
                *(void **)(*local_10 + 8) = pvVar4;
                if (*(long *)(*local_10 + 8) == 0) {
                  (*driverTable[local_28].close)(in_stack_fffffffffffff734);
                  ffpmsg((char *)0x11d9ef);
                  ffpmsg((char *)0x11d9fc);
                  free((void *)*local_10);
                  *local_10 = 0;
                  *local_20 = 0x71;
                  local_4 = 0x71;
                }
                else {
                  sVar3 = strlen(local_38);
                  local_8d4 = (int)sVar3 + 1;
                  if (local_8d4 < 0x21) {
                    local_8d4 = 0x20;
                  }
                  local_2c = local_8d4;
                  pvVar4 = malloc((long)local_8d4);
                  *(void **)(*(long *)(*local_10 + 8) + 0x10) = pvVar4;
                  if (*(long *)(*(long *)(*local_10 + 8) + 0x10) == 0) {
                    (*driverTable[local_28].close)(in_stack_fffffffffffff734);
                    ffpmsg((char *)0x11daea);
                    ffpmsg((char *)0x11daf7);
                    free(*(void **)(*local_10 + 8));
                    free((void *)*local_10);
                    *local_10 = 0;
                    *local_20 = 0x69;
                    local_4 = 0x69;
                  }
                  else {
                    pvVar4 = calloc(0x3e9,8);
                    *(void **)(*(long *)(*local_10 + 8) + 0x68) = pvVar4;
                    if (*(long *)(*(long *)(*local_10 + 8) + 0x68) == 0) {
                      (*driverTable[local_28].close)(in_stack_fffffffffffff734);
                      ffpmsg((char *)0x11dbb6);
                      ffpmsg((char *)0x11dbc3);
                      free(*(void **)(*(long *)(*local_10 + 8) + 0x10));
                      free(*(void **)(*local_10 + 8));
                      free((void *)*local_10);
                      *local_10 = 0;
                      *local_20 = 0x71;
                      local_4 = 0x71;
                    }
                    else {
                      pvVar4 = calloc(0x28,0xb40);
                      *(void **)(*(long *)(*local_10 + 8) + 0x560) = pvVar4;
                      if (*(long *)(*(long *)(*local_10 + 8) + 0x560) == 0) {
                        (*driverTable[local_28].close)(in_stack_fffffffffffff734);
                        ffpmsg((char *)0x11dca0);
                        ffpmsg((char *)0x11dcad);
                        free(*(void **)(*(long *)(*local_10 + 8) + 0x68));
                        free(*(void **)(*(long *)(*local_10 + 8) + 0x10));
                        free(*(void **)(*local_10 + 8));
                        free((void *)*local_10);
                        *local_10 = 0;
                        *local_20 = 0x71;
                        local_4 = 0x71;
                      }
                      else {
                        for (local_24 = 0; local_24 < 0x28; local_24 = local_24 + 1) {
                          *(int *)(*(long *)(*local_10 + 8) + 0x748 + (long)local_24 * 4) = local_24
                          ;
                          *(undefined8 *)(*(long *)(*local_10 + 8) + 0x568 + (long)local_24 * 8) =
                               0xffffffffffffffff;
                        }
                        *(undefined4 *)(*(long *)(*local_10 + 8) + 100) = 1000;
                        **(int **)(*local_10 + 8) = in_stack_fffffffffffff734;
                        *(int *)(*(long *)(*local_10 + 8) + 4) = local_28;
                        strcpy(*(char **)(*(long *)(*local_10 + 8) + 0x10),local_38);
                        *(undefined8 *)(*(long *)(*local_10 + 8) + 0x28) = 0;
                        *(undefined8 *)(*(long *)(*local_10 + 8) + 0x30) = 0;
                        *(undefined4 *)(*(long *)(*local_10 + 8) + 0x5c) = 1;
                        *(undefined8 *)(*(long *)(*local_10 + 8) + 0x88) = 0xffffffffffffffff;
                        *(undefined4 *)(*(long *)(*local_10 + 8) + 0x50) = 0xffffffff;
                        *(undefined4 *)(*(long *)(*local_10 + 8) + 8) = 1;
                        *(undefined4 *)(*(long *)(*local_10 + 8) + 0x18) = 0x22b;
                        *(uint *)(*(long *)(*local_10 + 8) + 0x20) = uVar5;
                        ffldrc(in_stack_fffffffffffff758,(long)in_stack_fffffffffffff750,
                               in_stack_fffffffffffff74c,in_stack_fffffffffffff740);
                        fits_store_Fptr(*(FITSfile **)(*local_10 + 8),local_20);
                        if (in_stack_fffffffffffff788 != '\0') {
                          ffoptplt(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                   in_stack_fffffffffffff798);
                        }
                        if (in_stack_fffffffffffff738 != '\0') {
                          ffparsecompspec((fitsfile *)
                                          CONCAT71(in_stack_fffffffffffff789,
                                                   in_stack_fffffffffffff788),
                                          in_stack_fffffffffffff780,in_stack_fffffffffffff778);
                        }
                        local_4 = *local_20;
                      }
                    }
                  }
                }
              }
            }
            else {
              ffpmsg((char *)0x11d8ac);
              ffpmsg((char *)0x11d8b9);
              local_4 = *local_20;
            }
          }
        }
        else {
          ffpmsg((char *)0x11d7c5);
          ffpmsg((char *)0x11d7d2);
          local_4 = *local_20;
        }
      }
    }
    else {
      local_4 = *local_20;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}